

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O2

bool ctemplate::AnyMightModify
               (vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
                *modifiers,PerExpandData *data)

{
  pointer pMVar1;
  TemplateModifier *pTVar2;
  pointer pMVar3;
  int iVar4;
  pointer pMVar5;
  string value_string;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  pMVar3 = (modifiers->
           super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
           )._M_impl.super__Vector_impl_data._M_start;
  do {
    pMVar5 = pMVar3;
    pMVar1 = (modifiers->
             super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pMVar5 == pMVar1) break;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,pMVar5->value,pMVar5->value + pMVar5->value_len);
    pTVar2 = pMVar5->modifier_info->modifier;
    iVar4 = (*pTVar2->_vptr_TemplateModifier[1])(pTVar2,data,(string *)local_50);
    std::__cxx11::string::~string((string *)local_50);
    pMVar3 = pMVar5 + 1;
  } while ((char)iVar4 == '\0');
  return pMVar5 != pMVar1;
}

Assistant:

static bool AnyMightModify(const vector<ModifierAndValue>& modifiers,
                           const PerExpandData* data) {
  for (vector<ModifierAndValue>::const_iterator it = modifiers.begin();
       it != modifiers.end();  ++it) {
    string value_string(it->value, it->value_len);
    if (it->modifier_info->modifier->MightModify(data, value_string)) {
      return true;
    }
  }
  return false;
}